

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O2

void lzma_mf_hc3_skip(lzma_mf *mf,uint32_t amount)

{
  uint32_t uVar1;
  uint8_t *puVar2;
  uint32_t *puVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  
  do {
    uVar4 = mf->read_pos;
    if (mf->write_pos - uVar4 < 3) {
      move_pending(mf);
    }
    else {
      uVar5 = mf->offset + uVar4;
      puVar2 = mf->buffer;
      puVar3 = mf->hash;
      uVar6 = (uint)puVar2[(ulong)uVar4 + 1] ^ lzma_crc32_table[0][puVar2[uVar4]];
      uVar4 = (((uint)puVar2[(ulong)uVar4 + 2] << 8 ^ uVar6) & mf->hash_mask) + 0x400;
      uVar1 = puVar3[uVar4];
      puVar3[uVar6 & 0x3ff] = uVar5;
      puVar3[uVar4] = uVar5;
      mf->son[mf->cyclic_pos] = uVar1;
      move_pos(mf);
    }
    amount = amount - 1;
  } while (amount != 0);
  return;
}

Assistant:

extern void
lzma_mf_hc3_skip(lzma_mf *mf, uint32_t amount)
{
	do {
		if (mf_avail(mf) < 3) {
			move_pending(mf);
			continue;
		}

		const uint8_t *cur = mf_ptr(mf);
		const uint32_t pos = mf->read_pos + mf->offset;

		hash_3_calc();

		const uint32_t cur_match
				= mf->hash[FIX_3_HASH_SIZE + hash_value];

		mf->hash[hash_2_value] = pos;
		mf->hash[FIX_3_HASH_SIZE + hash_value] = pos;

		hc_skip();

	} while (--amount != 0);
}